

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O1

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::onRecoverableException
          (MockExceptionCallback *this,Exception *exception)

{
  string *psVar1;
  char *pcVar2;
  char *pcVar3;
  String what;
  long lVar4;
  char *local_38;
  long local_30;
  undefined8 *local_28;
  
  psVar1 = &this->text;
  ::std::__cxx11::string::append((char *)psVar1);
  kj::operator*(&local_38,exception);
  pcVar3 = "";
  if (local_30 != 0) {
    pcVar3 = local_38;
  }
  pcVar2 = strstr(pcVar3,"\nstack: ");
  if (pcVar2 == (char *)0x0) {
    ::std::__cxx11::string::append((char *)psVar1);
    pcVar3 = local_38;
    lVar4 = local_30;
  }
  else {
    ::std::__cxx11::string::replace
              ((ulong)psVar1,(this->text)._M_string_length,(char *)0x0,(ulong)pcVar3);
    pcVar3 = local_38;
    lVar4 = local_30;
  }
  ::std::__cxx11::string::push_back((char)psVar1);
  flush(this);
  if (pcVar3 != (char *)0x0) {
    (**(code **)*local_28)(local_28,pcVar3,1,lVar4,lVar4,0,0,0);
  }
  return;
}

Assistant:

void onRecoverableException(Exception&& exception) override {
    text += "recoverable exception: ";
    auto what = str(exception);
    // Discard the stack trace.
    const char* end = strstr(what.cStr(), "\nstack: ");
    if (end == nullptr) {
      text += what.cStr();
    } else {
      text.append(what.cStr(), end);
    }
    text += '\n';
    flush();
  }